

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterhammer.cpp
# Opt level: O3

int AF_A_FHammerThrow(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  long *plVar3;
  AWeapon *this;
  PClass *pPVar4;
  PClass *pPVar5;
  PClassActor *type;
  AActor *pAVar6;
  undefined4 in_register_00000014;
  ulong uVar7;
  VMValue *pVVar8;
  char *__assertion;
  undefined8 *puVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  uVar7 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005dc59a;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005dc58a;
  puVar9 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar9 == (undefined8 *)0x0) goto LAB_005dc45e;
    auVar12._8_8_ = uVar7;
    auVar12._0_8_ = puVar9[1];
    if (puVar9[1] == 0) {
      auVar12 = (**(code **)*puVar9)(puVar9);
      puVar9[1] = auVar12._0_8_;
    }
    pPVar5 = auVar12._0_8_;
    bVar10 = pPVar5 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar10;
    uVar7 = (ulong)bVar10;
    bVar11 = pPVar5 == pPVar4;
    if (!bVar11 && !bVar10) {
      do {
        pPVar5 = pPVar5->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar5 != (PClass *)0x0);
        if (pPVar5 == pPVar4) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    pVVar8 = (VMValue *)(ulong)(bVar11 || bVar10);
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005dc59a;
    }
  }
  else {
    if (puVar9 != (undefined8 *)0x0) goto LAB_005dc58a;
LAB_005dc45e:
    puVar9 = (undefined8 *)0x0;
    pVVar8 = param;
  }
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) goto LAB_005dc51b;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_005dc58a:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_005dc59a;
    }
    puVar2 = (undefined8 *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (puVar2 != (undefined8 *)0x0) {
        pPVar5 = (PClass *)puVar2[1];
        if (pPVar5 == (PClass *)0x0) {
          pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar8,uVar7,ret);
          puVar2[1] = pPVar5;
        }
        bVar10 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar4 && bVar10) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar10 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar4) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar10) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005dc59a;
        }
      }
    }
    else if (puVar2 != (undefined8 *)0x0) goto LAB_005dc58a;
  }
  if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005dc51b:
    plVar3 = (long *)puVar9[0x40];
    if ((plVar3 != (long *)0x0) && (pAVar6 = (AActor *)*plVar3, pAVar6->weaponspecial != 0)) {
      this = (AWeapon *)plVar3[0x1a];
      if (this != (AWeapon *)0x0) {
        bVar10 = AWeapon::DepleteAmmo(this,this->bAltFire,false,-1);
        if (!bVar10) {
          return 0;
        }
        pAVar6 = (AActor *)*plVar3;
      }
      type = PClass::FindActor("HammerMissile");
      pAVar6 = P_SpawnPlayerMissile(pAVar6,type);
      if (pAVar6 != (AActor *)0x0) {
        pAVar6->special1 = 0;
      }
    }
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_005dc59a:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterhammer.cpp"
                ,0x62,"int AF_A_FHammerThrow(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FHammerThrow)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;
	player_t *player;

	if (NULL == (player = self->player))
	{
		return 0;
	}

	if (!player->mo->weaponspecial)
	{
		return 0;
	}
	AWeapon *weapon = player->ReadyWeapon;
	if (weapon != NULL)
	{
		if (!weapon->DepleteAmmo (weapon->bAltFire, false))
			return 0;
	}
	mo = P_SpawnPlayerMissile (player->mo, PClass::FindActor("HammerMissile")); 
	if (mo)
	{
		mo->special1 = 0;
	}
	return 0;
}